

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O2

int __thiscall kstream<gzFile_s_*,_FunctorZlib>::getHeader(kstream<gzFile_s_*,_FunctorZlib> *this)

{
  int iVar1;
  ostream *poVar2;
  FILE *in_RSI;
  
  while ((iVar1 = getc(this,in_RSI), iVar1 != 0x40 && (iVar1 != 0x3e))) {
    if (iVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: The file appears to be empty");
      std::endl<char,std::char_traits<char>>(poVar2);
      return -1;
    }
  }
  this->begin = this->begin + -1;
  return 10;
}

Assistant:

int getHeader() {
        int c;
        while ((c = this->getc()) != -1 && c != '>' && c != '@');
        if (c == -1) {
            std::cerr << "ERROR: The file appears to be empty" << std::endl;
            return -1;
        }
        if (c == int('>') || c == int('@')){
            begin--;
            c = int('\n');
        }
        return c;
    }